

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O1

void csp_eth_arp_get_addr(uint8_t *mac_addr,uint16_t csp_addr)

{
  arp_list_entry_s *paVar1;
  
  paVar1 = arp_list;
  do {
    if (paVar1 == (arp_list_entry_t *)0x0) {
LAB_0010e03b:
      mac_addr[4] = 0xff;
      mac_addr[5] = 0xff;
      mac_addr[0] = 0xff;
      mac_addr[1] = 0xff;
      mac_addr[2] = 0xff;
      mac_addr[3] = 0xff;
      return;
    }
    if (paVar1->csp_addr == csp_addr) {
      *(undefined2 *)(mac_addr + 4) = *(undefined2 *)(paVar1->mac_addr + 4);
      *(undefined4 *)mac_addr = *(undefined4 *)paVar1->mac_addr;
      if (paVar1 != (arp_list_entry_t *)0x0) {
        return;
      }
      goto LAB_0010e03b;
    }
    paVar1 = paVar1->next;
  } while( true );
}

Assistant:

void csp_eth_arp_get_addr(uint8_t * mac_addr, uint16_t csp_addr)
{
    for (arp_list_entry_t * arp = arp_list; arp ; arp = arp->next) {
        if (arp->csp_addr == csp_addr) {
            memcpy(mac_addr, arp->mac_addr, CSP_ETH_ALEN);
            return;
        }
    }
    // Defaults to returning the broadcast address
    memset(mac_addr, 0xff, CSP_ETH_ALEN);
}